

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

Vec_Int_t * Llb_Nonlin4CreateVars2Q(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder,int fBackward)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  void *pvVar9;
  uint uVar10;
  
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0;
  pVVar4->nSize = 0;
  pVVar4->pArray = (int *)0x0;
  uVar3 = Cudd_ReadSize(dd);
  if (0 < (int)uVar3) {
    piVar5 = (int *)malloc((ulong)uVar3 * 4);
    pVVar4->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar4->nCap = uVar3;
    if (0 < (int)uVar3) {
      piVar5 = pVVar4->pArray;
      uVar7 = 0;
      do {
        piVar5[uVar7] = 1;
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
  }
  pVVar4->nSize = uVar3;
  if (0 < pAig->nRegs) {
    pVVar2 = pAig->vCos;
    iVar6 = 0;
    do {
      uVar8 = pAig->nTruePos + iVar6;
      if (((((int)uVar8 < 0) || (pVVar2->nSize <= (int)uVar8)) ||
          (uVar10 = pAig->nTruePis + iVar6, (int)uVar10 < 0)) || (pAig->vCis->nSize <= (int)uVar10))
      {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (fBackward == 0) {
        pvVar9 = pVVar2->pArray[uVar8];
      }
      else {
        pvVar9 = pAig->vCis->pArray[uVar10];
      }
      iVar1 = *(int *)((long)pvVar9 + 0x24);
      if (((long)iVar1 < 0) || (vOrder->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = vOrder->pArray[iVar1];
      if (((long)iVar1 < 0) || ((int)uVar3 <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar4->pArray[iVar1] = 0;
      iVar6 = iVar6 + 1;
    } while (iVar6 < pAig->nRegs);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateVars2Q( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder, int fBackward )
{
    Vec_Int_t * vVars2Q;
    Aig_Obj_t * pObjLi, * pObjLo;
    int i;
    vVars2Q = Vec_IntAlloc( 0 );
    Vec_IntFill( vVars2Q, Cudd_ReadSize(dd), 1 );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
        Vec_IntWriteEntry( vVars2Q, Llb_ObjBddVar(vOrder, fBackward ? pObjLo : pObjLi), 0 );
    return vVars2Q;
}